

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O1

void sptk::world::anon_unknown_5::HarvestGeneralBody
               (double *x,int x_length,int fs,int frame_period,double f0_floor,double f0_ceil,
               double channels_in_octave,int speed,double allowed_range,double *temporal_positions,
               double *f0)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  fft_plan p_03;
  fft_plan p_04;
  fft_plan p_05;
  fft_plan p_06;
  undefined8 uVar4;
  undefined8 uVar5;
  double *pdVar6;
  int i_7;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint x_length_00;
  uint x_length_01;
  uint x_length_02;
  int iVar11;
  long lVar12;
  double *pdVar13;
  double *in;
  fft_complex *out;
  ulong uVar14;
  long *plVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  double *pdVar19;
  double *pdVar20;
  fft_complex *out_00;
  fft_complex *padVar21;
  double *interval_locations;
  void *pvVar22;
  double *interval_locations_00;
  double *intervals;
  double *intervals_00;
  undefined4 *puVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  double *pdVar27;
  int *piVar28;
  double **ppdVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  long *plVar33;
  uint uVar34;
  long *plVar35;
  fft_plan *pfVar36;
  undefined8 *puVar37;
  ulong uVar38;
  ulong uVar39;
  undefined8 *puVar40;
  undefined4 in_register_00000084;
  ulong uVar41;
  int i_4;
  int i;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  int i_6;
  int iVar45;
  long lVar46;
  uint xi_length;
  uint uVar47;
  ulong uVar48;
  int i_1;
  int iVar49;
  int iVar50;
  ulong uVar51;
  long lVar52;
  ulong uVar53;
  byte bVar54;
  ulong uVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  int iVar66;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int maximum_number;
  fft_plan forwardFFT;
  fft_plan inverseFFT;
  int in_stack_fffffffffffffd38;
  double *in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd48 [24];
  undefined1 in_stack_fffffffffffffd60 [40];
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined1 local_e8 [24];
  double *pdStack_d0;
  fft_complex *local_c8;
  fft_complex *padStack_c0;
  double *local_b8;
  fft_complex *padStack_b0;
  double *local_a8;
  double *pdStack_a0;
  int *local_98;
  double *pdStack_90;
  size_t local_80;
  fft_plan local_78;
  long lVar72;
  
  pdVar27 = (double *)CONCAT44(in_register_00000084,speed);
  bVar54 = 0;
  dVar56 = log((f0_ceil * 1.1) / (f0_floor * 0.9));
  iVar49 = (int)((dVar56 / 0.6931471805599453) * 40.0);
  uVar34 = iVar49 + 1;
  uVar53 = (ulong)uVar34;
  lVar12 = (long)(int)uVar34;
  uVar39 = lVar12 * 8;
  uVar38 = uVar39;
  if (iVar49 < -1) {
    uVar38 = 0xffffffffffffffff;
  }
  pdVar13 = (double *)operator_new__(uVar38);
  if (-1 < iVar49) {
    uVar38 = 0;
    do {
      uVar41 = uVar38 + 1;
      dVar56 = exp2((double)(int)uVar41 / 40.0);
      pdVar13[uVar38] = dVar56 * f0_floor * 0.9;
      uVar38 = uVar41;
    } while (uVar53 != uVar41);
  }
  iVar45 = 0xc;
  if (frame_period < 0xc) {
    iVar45 = frame_period;
  }
  iVar9 = 1;
  if (1 < iVar45) {
    iVar9 = iVar45;
  }
  dVar57 = (double)x_length;
  dVar56 = (double)iVar9;
  dVar58 = ceil(dVar57 / dVar56);
  uVar30 = (uint)dVar58;
  uVar41 = (ulong)uVar30;
  dVar58 = (double)fs / dVar56;
  uVar7 = GetSuitableFFTSize(uVar30 + (int)((dVar58 + dVar58) / *pdVar13) * 2 + 5);
  uVar38 = (long)(int)uVar7 * 8;
  uVar43 = (long)(int)uVar7 << 4;
  if ((int)uVar7 < 0) {
    uVar38 = 0xffffffffffffffff;
    uVar43 = 0xffffffffffffffff;
  }
  in = (double *)operator_new__(uVar38);
  out = (fft_complex *)operator_new__(uVar43);
  uVar55 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    memset(in,0,uVar55 * 8);
  }
  if (frame_period < 2) {
    if (0 < x_length) {
      memcpy(in,x,(ulong)(uint)x_length << 3);
    }
  }
  else {
    dVar59 = ceil(140.0 / dVar56);
    uVar8 = (uint)(dVar59 * dVar56);
    iVar45 = x_length + uVar8 * 2;
    lVar32 = (long)iVar45;
    uVar31 = 0xffffffffffffffff;
    if (-1 < iVar45) {
      uVar31 = lVar32 * 8;
    }
    pvVar16 = operator_new__(uVar31);
    if (0 < iVar45) {
      memset(pvVar16,0,(ulong)(iVar45 - 1) * 8 + 8);
    }
    uVar87 = SUB84(pvVar16,0);
    uVar88 = (undefined4)((ulong)pvVar16 >> 0x20);
    pdVar19 = (double *)operator_new__(uVar31);
    auVar76 = _DAT_0012b210;
    auVar77 = _DAT_0012aa40;
    if (0 < (int)uVar8) {
      dVar56 = *x;
      lVar52 = (ulong)uVar8 - 1;
      auVar75._8_4_ = (int)lVar52;
      auVar75._0_8_ = lVar52;
      auVar75._12_4_ = (int)((ulong)lVar52 >> 0x20);
      lVar52 = 0;
      auVar75 = auVar75 ^ _DAT_0012aa40;
      auVar73 = _DAT_0012aa30;
      do {
        bVar3 = auVar75._0_4_ < SUB164(auVar73 ^ auVar77,0);
        iVar11 = auVar75._4_4_;
        iVar50 = SUB164(auVar73 ^ auVar77,4);
        if ((bool)(~(iVar11 < iVar50 || iVar50 == iVar11 && bVar3) & 1)) {
          *(double *)((long)pdVar19 + lVar52) = dVar56;
        }
        if (iVar11 >= iVar50 && (iVar50 != iVar11 || !bVar3)) {
          *(double *)((long)pdVar19 + lVar52 + 8) = dVar56;
        }
        lVar44 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + auVar76._0_8_;
        auVar73._8_8_ = lVar44 + auVar76._8_8_;
        lVar52 = lVar52 + 0x10;
      } while ((ulong)(uVar8 + 1 >> 1) << 4 != lVar52);
    }
    iVar11 = x_length + uVar8;
    if (0 < x_length) {
      iVar50 = uVar8 + 1;
      if ((int)(uVar8 + 1) < iVar11) {
        iVar50 = iVar11;
      }
      memcpy(pdVar19 + (int)uVar8,x,(ulong)(~uVar8 + iVar50) * 8 + 8);
    }
    auVar76 = _DAT_0012aa40;
    auVar77 = _DAT_0012aa30;
    if ((int)uVar8 < (int)(uVar8 * 2)) {
      dVar56 = x[(long)x_length + -1];
      lVar44 = (long)iVar11;
      lVar52 = lVar44 + 1;
      if (lVar44 + 1 < lVar32) {
        lVar52 = lVar32;
      }
      lVar32 = (lVar52 - lVar44) + -1;
      auVar67._8_4_ = (int)lVar32;
      auVar67._0_8_ = lVar32;
      auVar67._12_4_ = (int)((ulong)lVar32 >> 0x20);
      uVar31 = 0;
      auVar67 = auVar67 ^ _DAT_0012aa40;
      do {
        auVar81._8_4_ = (int)uVar31;
        auVar81._0_8_ = uVar31;
        auVar81._12_4_ = (int)(uVar31 >> 0x20);
        auVar73 = (auVar81 | auVar77) ^ auVar76;
        bVar3 = auVar67._0_4_ < auVar73._0_4_;
        iVar11 = auVar67._4_4_;
        iVar50 = auVar73._4_4_;
        if ((bool)(~(iVar11 < iVar50 || iVar50 == iVar11 && bVar3) & 1)) {
          pdVar19[lVar44 + uVar31] = dVar56;
        }
        if (iVar11 >= iVar50 && (iVar50 != iVar11 || !bVar3)) {
          pdVar19[lVar44 + uVar31 + 1] = dVar56;
        }
        uVar31 = uVar31 + 2;
      } while (((lVar52 - lVar44) + 1U & 0xfffffffffffffffe) != uVar31);
    }
    pdVar20 = (double *)CONCAT44(uVar88,uVar87);
    decimate(pdVar19,iVar45,iVar9,pdVar20);
    if (0 < (int)uVar30) {
      memcpy(in,pdVar20 + (int)uVar8 / iVar9,uVar41 << 3);
    }
    operator_delete__(pdVar19);
    operator_delete__(pdVar20);
    dVar56 = (double)CONCAT44(uVar88,uVar87);
  }
  if ((int)uVar30 < 1) {
    dVar59 = 0.0;
  }
  else {
    dVar59 = 0.0;
    uVar31 = 0;
    do {
      dVar59 = dVar59 + in[uVar31];
      uVar31 = uVar31 + 1;
    } while (uVar41 != uVar31);
  }
  if (0 < (int)uVar30) {
    uVar31 = 0;
    do {
      in[uVar31] = in[uVar31] - dVar59 / (double)(int)uVar30;
      uVar31 = uVar31 + 1;
    } while (uVar41 != uVar31);
  }
  if ((int)uVar30 < (int)uVar7) {
    memset(in + (int)uVar30,0,(ulong)(~uVar30 + uVar7) * 8 + 8);
  }
  fft_plan_dft_r2c_1d((fft_plan *)local_e8,uVar7,in,out,3);
  lVar32 = 9;
  pfVar36 = (fft_plan *)local_e8;
  puVar37 = (undefined8 *)&stack0xfffffffffffffd38;
  while( true ) {
    if (lVar32 == 0) break;
    lVar32 = lVar32 + -1;
    *puVar37 = *(undefined8 *)pfVar36;
    pfVar36 = (fft_plan *)((long)pfVar36 + (ulong)bVar54 * -0x10 + 8);
    puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
  }
  p_02.out._0_4_ = SUB84(dVar56,0);
  p_02.n = in_stack_fffffffffffffd60._0_4_;
  p_02.sign = in_stack_fffffffffffffd60._4_4_;
  p_02.flags = in_stack_fffffffffffffd60._8_4_;
  p_02._12_4_ = in_stack_fffffffffffffd60._12_4_;
  p_02.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
  p_02.in = (double *)in_stack_fffffffffffffd60._24_8_;
  p_02.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
  p_02.out._4_4_ = (int)((ulong)dVar56 >> 0x20);
  p_02.input._0_4_ = in_stack_fffffffffffffd90;
  p_02.input._4_4_ = in_stack_fffffffffffffd94;
  p_02.ip._0_4_ = (int)uVar39;
  p_02.ip._4_4_ = (int)(uVar39 >> 0x20);
  p_02.w._0_4_ = SUB84(dVar57,0);
  p_02.w._4_4_ = (int)((ulong)dVar57 >> 0x20);
  fft_execute(p_02);
  pfVar36 = (fft_plan *)local_e8;
  puVar37 = (undefined8 *)&stack0xfffffffffffffd38;
  for (lVar32 = 9; lVar32 != 0; lVar32 = lVar32 + -1) {
    *puVar37 = *(undefined8 *)pfVar36;
    pfVar36 = (fft_plan *)((long)pfVar36 + (ulong)bVar54 * -0x10 + 8);
    puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
  }
  p.flags = in_stack_fffffffffffffd48._0_4_;
  p._12_4_ = in_stack_fffffffffffffd48._4_4_;
  p.c_in = (fft_complex *)in_stack_fffffffffffffd48._8_8_;
  p.in = (double *)in_stack_fffffffffffffd48._16_8_;
  p._0_8_ = in_stack_fffffffffffffd40;
  p.c_out = (fft_complex *)in_stack_fffffffffffffd60._0_8_;
  p.out = (double *)in_stack_fffffffffffffd60._8_8_;
  p.input = (double *)in_stack_fffffffffffffd60._16_8_;
  p.ip = (int *)in_stack_fffffffffffffd60._24_8_;
  p.w = (double *)in_stack_fffffffffffffd60._32_8_;
  fft_destroy_plan(p);
  uVar8 = (uint)((dVar57 * 1000.0) / (double)fs);
  xi_length = uVar8 + 1;
  uVar31 = (ulong)xi_length;
  uVar87 = 0;
  if (-1 < (int)uVar8) {
    uVar14 = 0;
    do {
      pdVar27[uVar14] = (double)(int)uVar14 / 1000.0;
      temporal_positions[uVar14] = 0.0;
      uVar14 = uVar14 + 1;
    } while (uVar31 != uVar14);
  }
  iVar9 = matlab_round((double)(int)uVar34 / 10.0);
  iVar45 = iVar9 * 7;
  lVar32 = (long)(int)xi_length;
  uVar14 = lVar32 * 8;
  if ((int)uVar8 < -1) {
    uVar14 = 0xffffffffffffffff;
  }
  uVar34 = uVar8;
  plVar15 = (long *)operator_new__(uVar14);
  pvVar16 = operator_new__(uVar14);
  if (-1 < (int)uVar8) {
    uVar48 = (long)iVar45 << 3;
    if (iVar9 < 0) {
      uVar48 = 0xffffffffffffffff;
    }
    uVar51 = 0;
    do {
      pvVar17 = operator_new__(uVar48);
      plVar15[uVar51] = (long)pvVar17;
      pvVar17 = operator_new__(uVar48);
      *(void **)((long)pvVar16 + uVar51 * 8) = pvVar17;
      uVar51 = uVar51 + 1;
    } while (uVar31 != uVar51);
  }
  if (iVar49 < -1) {
    uVar39 = 0xffffffffffffffff;
  }
  pvVar17 = operator_new__(uVar39);
  if (-1 < iVar49) {
    uVar39 = 0;
    do {
      pvVar18 = operator_new__(uVar14);
      *(void **)((long)pvVar17 + uVar39 * 8) = pvVar18;
      uVar39 = uVar39 + 1;
    } while (uVar53 != uVar39);
    if (-1 < iVar49) {
      uVar39 = 0xffffffffffffffff;
      if (-1 < (int)uVar30) {
        uVar39 = (long)(int)uVar30 << 3;
      }
      uVar8 = uVar30 - 1;
      local_80 = uVar31 * 8;
      lVar52 = 0;
      do {
        dVar56 = pdVar13[lVar52];
        pvVar18 = *(void **)((long)pvVar17 + lVar52 * 8);
        pdVar19 = (double *)operator_new__(uVar38);
        uVar91 = (undefined4)((ulong)dVar57 >> 0x20);
        uVar10 = matlab_round(dVar58 / dVar56 + dVar58 / dVar56);
        pdVar20 = (double *)operator_new__(uVar38);
        iVar11 = uVar10 * 2;
        uVar90 = 0;
        iVar9 = uVar10 * 2 + 1;
        uVar88 = SUB84(pdVar20,0);
        uVar89 = (undefined4)((ulong)pdVar20 >> 0x20);
        NuttallWindow(iVar9,pdVar20);
        if (-1 < (int)uVar10) {
          iVar50 = iVar11 + 1;
          lVar44 = (ulong)uVar10 * 8 + (long)(int)uVar10 * -8 + CONCAT44(uVar89,uVar88);
          lVar46 = 0;
          do {
            dVar57 = cos(((double)(int)((int)lVar46 - uVar10) * dVar56 * 6.283185307179586) / dVar58
                        );
            *(double *)(lVar44 + lVar46 * 8) = dVar57 * *(double *)(lVar44 + lVar46 * 8);
            lVar46 = lVar46 + 1;
          } while (iVar50 != (int)lVar46);
        }
        if (iVar9 < (int)uVar7) {
          memset((void *)(CONCAT44(uVar89,uVar88) + (long)iVar11 * 8 + 8),0,
                 (ulong)((uVar7 - 2) - iVar11) * 8 + 8);
        }
        out_00 = (fft_complex *)operator_new__(uVar43);
        fft_plan_dft_r2c_1d((fft_plan *)local_e8,uVar7,(double *)CONCAT44(uVar89,uVar88),out_00,3);
        pfVar36 = (fft_plan *)local_e8;
        puVar37 = (undefined8 *)&stack0xfffffffffffffd38;
        for (lVar44 = 9; lVar44 != 0; lVar44 = lVar44 + -1) {
          *puVar37 = *(undefined8 *)pfVar36;
          pfVar36 = (fft_plan *)((long)pfVar36 + (ulong)bVar54 * -0x10 + 8);
          puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
        }
        p_03.out._0_4_ = uVar88;
        p_03.n = in_stack_fffffffffffffd60._0_4_;
        p_03.sign = in_stack_fffffffffffffd60._4_4_;
        p_03.flags = in_stack_fffffffffffffd60._8_4_;
        p_03._12_4_ = in_stack_fffffffffffffd60._12_4_;
        p_03.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
        p_03.in = (double *)in_stack_fffffffffffffd60._24_8_;
        p_03.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
        p_03.out._4_4_ = uVar89;
        p_03.input._0_4_ = uVar34;
        p_03.input._4_4_ = uVar87;
        p_03.ip._0_4_ = iVar11;
        p_03.ip._4_4_ = uVar90;
        p_03.w._0_4_ = iVar9;
        p_03.w._4_4_ = uVar91;
        fft_execute(p_03);
        dVar57 = (*out)[0];
        dVar59 = (*out)[1];
        uVar48 = (ulong)DAT_0012b340;
        dVar61 = (*out_00)[0];
        dVar1 = (*out_00)[1];
        (*out_00)[0] = dVar57 * dVar61 + dVar1 * (double)((ulong)dVar59 ^ uVar48);
        (*out_00)[1] = dVar57 * dVar1 + dVar61 * dVar59;
        if (1 < (int)uVar7) {
          padVar21 = out_00 + (uVar55 - 2);
          uVar51 = 0;
          do {
            dVar57 = *(double *)((long)out[1] + uVar51);
            dVar59 = *(double *)((long)out[1] + uVar51 + 8);
            pdVar20 = (double *)((long)out_00[1] + uVar51);
            dVar61 = *pdVar20;
            dVar1 = pdVar20[1];
            dVar60 = dVar57 * dVar61 + dVar1 * (double)((ulong)dVar59 ^ uVar48);
            dVar57 = dVar57 * dVar1 + dVar61 * dVar59;
            pdVar20 = (double *)((long)out_00[1] + uVar51);
            *pdVar20 = dVar60;
            pdVar20[1] = dVar57;
            (*padVar21)[0] = dVar60;
            (*padVar21)[1] = dVar57;
            uVar51 = uVar51 + 0x10;
            padVar21 = padVar21 + -1;
          } while ((uVar55 * 8 & 0xfffffffffffffff0) != uVar51);
        }
        fft_plan_dft_c2r_1d(&local_78,uVar7,out_00,pdVar19,3);
        pfVar36 = &local_78;
        puVar37 = (undefined8 *)&stack0xfffffffffffffd38;
        for (lVar44 = 9; lVar44 != 0; lVar44 = lVar44 + -1) {
          *puVar37 = *(undefined8 *)pfVar36;
          pfVar36 = (fft_plan *)((long)pfVar36 + (ulong)bVar54 * -0x10 + 8);
          puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
        }
        p_04.out._0_4_ = uVar88;
        p_04.n = in_stack_fffffffffffffd60._0_4_;
        p_04.sign = in_stack_fffffffffffffd60._4_4_;
        p_04.flags = in_stack_fffffffffffffd60._8_4_;
        p_04._12_4_ = in_stack_fffffffffffffd60._12_4_;
        p_04.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
        p_04.in = (double *)in_stack_fffffffffffffd60._24_8_;
        p_04.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
        p_04.out._4_4_ = uVar89;
        p_04.input._0_4_ = uVar34;
        p_04.input._4_4_ = uVar87;
        p_04.ip._0_4_ = iVar11;
        p_04.ip._4_4_ = uVar90;
        p_04.w._0_4_ = iVar9;
        p_04.w._4_4_ = uVar91;
        fft_execute(p_04);
        pdVar20 = pdVar19;
        uVar48 = uVar41;
        if (0 < (int)uVar30) {
          do {
            *pdVar20 = pdVar20[(long)(int)uVar10 + 1];
            uVar48 = uVar48 - 1;
            pdVar20 = pdVar20 + 1;
          } while (uVar48 != 0);
        }
        pfVar36 = &local_78;
        puVar37 = (undefined8 *)&stack0xfffffffffffffd38;
        for (lVar44 = 9; lVar44 != 0; lVar44 = lVar44 + -1) {
          *puVar37 = *(undefined8 *)pfVar36;
          pfVar36 = (fft_plan *)((long)pfVar36 + ((ulong)bVar54 * -2 + 1) * 8);
          puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
        }
        p_00.flags = in_stack_fffffffffffffd48._0_4_;
        p_00._12_4_ = in_stack_fffffffffffffd48._4_4_;
        p_00.c_in = (fft_complex *)in_stack_fffffffffffffd48._8_8_;
        p_00.in = (double *)in_stack_fffffffffffffd48._16_8_;
        p_00._0_8_ = in_stack_fffffffffffffd40;
        p_00.c_out = (fft_complex *)in_stack_fffffffffffffd60._0_8_;
        p_00.out = (double *)in_stack_fffffffffffffd60._8_8_;
        p_00.input = (double *)in_stack_fffffffffffffd60._16_8_;
        p_00.ip = (int *)in_stack_fffffffffffffd60._24_8_;
        p_00.w = (double *)in_stack_fffffffffffffd60._32_8_;
        fft_destroy_plan(p_00);
        puVar37 = (undefined8 *)local_e8;
        puVar40 = (undefined8 *)&stack0xfffffffffffffd38;
        for (lVar44 = 9; lVar44 != 0; lVar44 = lVar44 + -1) {
          *puVar40 = *puVar37;
          puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
          puVar40 = puVar40 + (ulong)bVar54 * -2 + 1;
        }
        p_01.flags = in_stack_fffffffffffffd48._0_4_;
        p_01._12_4_ = in_stack_fffffffffffffd48._4_4_;
        p_01.c_in = (fft_complex *)in_stack_fffffffffffffd48._8_8_;
        p_01.in = (double *)in_stack_fffffffffffffd48._16_8_;
        p_01._0_8_ = in_stack_fffffffffffffd40;
        p_01.c_out = (fft_complex *)in_stack_fffffffffffffd60._0_8_;
        p_01.out = (double *)in_stack_fffffffffffffd60._8_8_;
        p_01.input = (double *)in_stack_fffffffffffffd60._16_8_;
        p_01.ip = (int *)in_stack_fffffffffffffd60._24_8_;
        p_01.w = (double *)in_stack_fffffffffffffd60._32_8_;
        fft_destroy_plan(p_01);
        operator_delete__(out_00);
        operator_delete__((void *)CONCAT44(uVar89,uVar88));
        pdVar20 = (double *)operator_new__(uVar39);
        interval_locations = (double *)operator_new__(uVar39);
        pvVar22 = operator_new__(uVar39);
        uVar88 = SUB84(pvVar22,0);
        uVar42 = (uint)((ulong)pvVar22 >> 0x20);
        interval_locations_00 = (double *)operator_new__(uVar39);
        intervals = (double *)operator_new__(uVar39);
        pvVar22 = operator_new__(uVar39);
        uVar89 = SUB84(pvVar22,0);
        uVar90 = (undefined4)((ulong)pvVar22 >> 0x20);
        pvVar22 = operator_new__(uVar39);
        uVar91 = SUB84(pvVar22,0);
        uVar47 = (uint)((ulong)pvVar22 >> 0x20);
        intervals_00 = (double *)operator_new__(uVar39);
        uVar10 = ZeroCrossingEngine(pdVar19,uVar30,dVar58,pdVar20,intervals);
        if (0 < (int)uVar30) {
          uVar48 = 0;
          do {
            pdVar19[uVar48] = -pdVar19[uVar48];
            uVar48 = uVar48 + 1;
          } while (uVar41 != uVar48);
        }
        x_length_00 = ZeroCrossingEngine(pdVar19,uVar30,dVar58,interval_locations,
                                         (double *)CONCAT44(uVar90,uVar89));
        if (1 < (int)uVar30) {
          uVar48 = 0;
          do {
            pdVar19[uVar48] = pdVar19[uVar48] - pdVar19[uVar48 + 1];
            uVar48 = uVar48 + 1;
          } while (uVar8 != uVar48);
        }
        x_length_01 = ZeroCrossingEngine(pdVar19,uVar8,dVar58,(double *)CONCAT44(uVar42,uVar88),
                                         (double *)CONCAT44(uVar47,uVar91));
        uVar48 = (ulong)DAT_0012b340;
        if (1 < (int)uVar30) {
          uVar51 = 0;
          do {
            pdVar19[uVar51] = (double)((ulong)pdVar19[uVar51] ^ uVar48);
            uVar51 = uVar51 + 1;
          } while (uVar8 != uVar51);
        }
        x_length_02 = ZeroCrossingEngine(pdVar19,uVar8,dVar58,interval_locations_00,intervals_00);
        if ((((uVar10 < 3) || (x_length_00 < 3)) || (x_length_01 < 3)) || (x_length_02 < 3)) {
          if (-1 < (int)uVar34) {
            memset(pvVar18,0,local_80);
          }
        }
        else {
          lVar44 = 0;
          do {
            pvVar22 = operator_new__(uVar14);
            *(void **)(local_e8 + lVar44 * 8) = pvVar22;
            uVar2 = local_e8._0_8_;
            lVar44 = lVar44 + 1;
          } while (lVar44 != 4);
          interp1(pdVar20,intervals,uVar10,pdVar27,xi_length,(double *)local_e8._0_8_);
          uVar4 = local_e8._8_8_;
          interp1(interval_locations,(double *)CONCAT44(uVar90,uVar89),x_length_00,pdVar27,xi_length
                  ,(double *)local_e8._8_8_);
          uVar5 = local_e8._16_8_;
          interp1((double *)CONCAT44(uVar42,uVar88),(double *)CONCAT44(uVar47,uVar91),x_length_01,
                  pdVar27,xi_length,(double *)local_e8._16_8_);
          pdVar6 = pdStack_d0;
          interp1(interval_locations_00,intervals_00,x_length_02,pdVar27,xi_length,pdStack_d0);
          if (-1 < (int)uVar34) {
            uVar48 = 0;
            do {
              dVar57 = (*(double *)(uVar2 + uVar48 * 8) + *(double *)(uVar4 + uVar48 * 8) +
                        ((double *)uVar5)[uVar48] + pdVar6[uVar48]) * 0.25;
              *(ulong *)((long)pvVar18 + uVar48 * 8) =
                   ~-(ulong)(dVar57 < f0_floor) &
                   ~-(ulong)(f0_ceil < dVar57) &
                   ~-(ulong)(dVar56 * 1.1 < dVar57) &
                   ~-(ulong)(dVar57 < dVar56 * 0.9) & (ulong)dVar57;
              uVar48 = uVar48 + 1;
            } while (uVar31 != uVar48);
          }
          lVar44 = 0;
          do {
            if (*(void **)(local_e8 + lVar44 * 8) != (void *)0x0) {
              operator_delete__(*(void **)(local_e8 + lVar44 * 8));
            }
            lVar44 = lVar44 + 1;
          } while (lVar44 != 4);
        }
        operator_delete__(pdVar20);
        operator_delete__(interval_locations);
        operator_delete__((void *)CONCAT44(uVar42,uVar88));
        operator_delete__(interval_locations_00);
        operator_delete__(intervals);
        operator_delete__((void *)CONCAT44(uVar90,uVar89));
        operator_delete__((void *)CONCAT44(uVar47,uVar91));
        operator_delete__(intervals_00);
        operator_delete__(pdVar19);
        dVar56 = (double)((ulong)uVar42 << 0x20);
        dVar57 = (double)((ulong)uVar47 << 0x20);
        lVar52 = lVar52 + 1;
      } while (lVar52 != lVar12);
    }
  }
  uVar39 = 0xffffffffffffffff;
  if (-2 < iVar49) {
    uVar39 = lVar12 * 4;
  }
  puVar23 = (undefined4 *)operator_new__(uVar39);
  uVar88 = (undefined4)((ulong)dVar56 >> 0x20);
  pvVar18 = operator_new__(uVar39);
  pvVar22 = operator_new__(uVar39);
  if ((int)uVar34 < 0) {
    uVar7 = 0;
  }
  else {
    uVar39 = 0;
    uVar7 = 0;
    do {
      if (-1 < iVar49) {
        uVar38 = 0;
        do {
          puVar23[uVar38] =
               (uint)(0.0 < *(double *)(*(long *)((long)pvVar17 + uVar38 * 8) + uVar39 * 8));
          uVar38 = uVar38 + 1;
        } while (uVar53 != uVar38);
      }
      uVar10 = 0;
      puVar23[lVar12 + -1] = 0;
      *puVar23 = 0;
      uVar8 = 0;
      if (0 < iVar49) {
        uVar8 = 0;
        uVar38 = 1;
        do {
          pvVar24 = pvVar18;
          uVar42 = uVar8;
          if (puVar23[uVar38] - puVar23[uVar38 - 1] == 1) {
LAB_0012424b:
            *(int *)((long)pvVar24 + (long)(int)uVar8 * 4) = (int)uVar38;
            uVar8 = uVar42;
          }
          else if (puVar23[uVar38] - puVar23[uVar38 - 1] == -1) {
            uVar42 = uVar8 + 1;
            pvVar24 = pvVar22;
            goto LAB_0012424b;
          }
          uVar38 = uVar38 + 1;
        } while (uVar53 != uVar38);
      }
      lVar52 = plVar15[uVar39];
      if (0 < (int)uVar8) {
        uVar38 = 0;
        uVar10 = 0;
        do {
          iVar9 = *(int *)((long)pvVar22 + uVar38 * 4);
          iVar11 = *(int *)((long)pvVar18 + uVar38 * 4);
          lVar44 = (long)iVar11;
          if (9 < iVar9 - iVar11) {
            dVar56 = 0.0;
            if (iVar11 < iVar9) {
              do {
                dVar56 = dVar56 + *(double *)(*(long *)((long)pvVar17 + lVar44 * 8) + uVar39 * 8);
                lVar44 = lVar44 + 1;
              } while (iVar9 != lVar44);
            }
            lVar44 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            *(double *)(lVar52 + lVar44 * 8) = dVar56 / (double)(iVar9 - iVar11);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar8);
      }
      if ((int)uVar10 < iVar45) {
        memset((void *)(lVar52 + (long)(int)uVar10 * 8),0,(ulong)(~uVar10 + iVar45) * 8 + 8);
      }
      if ((int)uVar7 <= (int)uVar10) {
        uVar7 = uVar10;
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar31);
  }
  operator_delete__(puVar23);
  operator_delete__(pvVar18);
  operator_delete__(pvVar22);
  lVar12 = uVar31 * 8;
  lVar52 = 1;
  lVar44 = 8;
  plVar33 = plVar15;
  uVar8 = uVar34;
  do {
    lVar12 = lVar12 + -8;
    plVar33 = plVar33 + 1;
    if (0 < (int)uVar7) {
      uVar39 = 0;
      do {
        if (lVar52 < lVar32) {
          lVar46 = 0;
          do {
            *(undefined8 *)
             (*(long *)((long)plVar33 + lVar46) + uVar39 * 8 + (ulong)(uVar7 * (int)lVar52) * 8) =
                 *(undefined8 *)(*(long *)((long)plVar15 + lVar46) + uVar39 * 8);
            lVar46 = lVar46 + 8;
          } while (lVar12 != lVar46);
          plVar35 = plVar15;
          uVar38 = (ulong)uVar8;
          if (lVar52 < lVar32) {
            do {
              *(undefined8 *)(*plVar35 + uVar39 * 8 + (ulong)(((int)lVar52 + 3) * uVar7) * 8) =
                   *(undefined8 *)(*(long *)((long)plVar35 + lVar44) + uVar39 * 8);
              plVar35 = plVar35 + 1;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != uVar7);
    }
    lVar52 = lVar52 + 1;
    uVar8 = uVar8 - 1;
    lVar44 = lVar44 + 8;
  } while (lVar52 != 4);
  uVar8 = uVar7;
  if (-1 < iVar49) {
    uVar39 = 0;
    do {
      pvVar18 = *(void **)((long)pvVar17 + uVar39 * 8);
      if (pvVar18 != (void *)0x0) {
        operator_delete__(pvVar18);
      }
      uVar39 = uVar39 + 1;
    } while (uVar53 != uVar39);
  }
  operator_delete__(pvVar17);
  uVar10 = uVar7 * 7;
  if (-1 < (int)uVar34) {
    uVar39 = 0;
    do {
      if (0 < (int)uVar7) {
        uVar38 = 0;
        do {
          lVar12 = plVar15[uVar39];
          dVar56 = *(double *)(lVar12 + uVar38 * 8);
          lVar52 = *(long *)((long)pvVar16 + uVar39 * 8);
          if (dVar56 <= 0.0) {
            *(undefined8 *)(lVar12 + uVar38 * 8) = 0;
            *(undefined8 *)(lVar52 + uVar38 * 8) = 0;
          }
          else {
            dVar57 = pdVar27[uVar39];
            uVar89 = SUB84(dVar56,0);
            uVar90 = (undefined4)((ulong)dVar56 >> 0x20);
            dVar56 = (dVar58 * 1.5) / dVar56 + 1.0;
            iVar45 = (int)dVar56;
            uVar42 = iVar45 * 2;
            uVar41 = (ulong)uVar42;
            iVar49 = iVar45 * 2 + 1;
            lVar44 = (long)iVar49;
            uVar53 = lVar44 * 8;
            if (iVar45 < 0) {
              uVar53 = 0xffffffffffffffff;
            }
            pdVar19 = (double *)operator_new__(uVar53);
            auVar76 = _DAT_0012b210;
            auVar77 = _DAT_0012aa40;
            if (-1 < iVar45) {
              uVar43 = 0;
              if (0 < (int)uVar42) {
                uVar43 = uVar41;
              }
              auVar62._8_4_ = (int)uVar43;
              auVar62._0_8_ = uVar43;
              auVar62._12_4_ = 0;
              iVar9 = -iVar45;
              lVar46 = 0;
              auVar68 = _DAT_0012aa30;
              do {
                auVar73 = auVar62 ^ auVar77;
                auVar75 = auVar68 ^ auVar77;
                bVar3 = auVar73._0_4_ < auVar75._0_4_;
                iVar11 = auVar73._4_4_;
                iVar50 = auVar75._4_4_;
                if ((bool)(~(iVar11 < iVar50 || iVar50 == iVar11 && bVar3) & 1)) {
                  *(double *)((long)pdVar19 + lVar46) = (double)iVar9 / dVar58;
                }
                if (iVar11 >= iVar50 && (iVar50 != iVar11 || !bVar3)) {
                  *(double *)((long)pdVar19 + lVar46 + 8) = (double)(iVar9 + 1) / dVar58;
                }
                lVar72 = auVar68._8_8_;
                auVar68._0_8_ = auVar68._0_8_ + auVar76._0_8_;
                auVar68._8_8_ = lVar72 + auVar76._8_8_;
                lVar46 = lVar46 + 0x10;
                iVar9 = iVar9 + 2;
              } while (uVar43 * 8 + 0x10 != lVar46);
            }
            dVar56 = (double)(int)dVar56;
            dVar56 = dVar56 + dVar56 + 1.0;
            dVar59 = log(dVar56);
            dVar59 = exp2((double)(int)(dVar59 / 0.6931471805599453) + 2.0);
            iVar9 = (int)dVar59;
            local_98 = (int *)0x0;
            pdStack_90 = (double *)0x0;
            local_a8 = (double *)0x0;
            pdStack_a0 = (double *)0x0;
            local_b8 = (double *)0x0;
            padStack_b0 = (fft_complex *)0x0;
            local_c8 = (fft_complex *)0x0;
            padStack_c0 = (fft_complex *)0x0;
            local_e8._16_8_ = (fft_complex *)0x0;
            pdStack_d0 = (double *)0x0;
            local_e8._0_8_ = (double *)0x0;
            local_e8._8_8_ = (double *)0x0;
            InitializeForwardRealFFT(iVar9,(ForwardRealFFT *)local_e8);
            uVar43 = (long)iVar9 << 4;
            if (iVar9 < 0) {
              uVar43 = 0xffffffffffffffff;
            }
            pvVar17 = operator_new__(uVar43);
            pvVar18 = operator_new__(uVar43);
            uVar43 = lVar44 * 4;
            if (iVar45 < 0) {
              uVar43 = 0xffffffffffffffff;
            }
            pvVar22 = operator_new__(uVar43);
            pvVar24 = operator_new__(uVar53);
            pdVar20 = (double *)operator_new__(uVar53);
            iVar11 = matlab_round((*pdVar19 + dVar57) * dVar58 + 0.001);
            auVar76 = _DAT_0012b210;
            auVar77 = _DAT_0012aa40;
            dVar59 = (double)CONCAT44(uVar88,uVar8);
            uVar91 = SUB84(pvVar22,0);
            uVar92 = (undefined4)((ulong)pvVar22 >> 0x20);
            if (-1 < iVar45) {
              dVar56 = dVar56 / dVar58;
              auVar63._4_4_ = 0;
              auVar63._0_4_ = uVar42;
              auVar63._8_4_ = uVar42;
              auVar63._12_4_ = 0;
              lVar46 = 0;
              auVar69 = _DAT_0012aa30;
              do {
                auVar73 = auVar63 ^ auVar77;
                auVar75 = auVar69 ^ auVar77;
                bVar3 = auVar73._0_4_ < auVar75._0_4_;
                iVar50 = auVar73._4_4_;
                iVar80 = auVar75._4_4_;
                if ((bool)(~(iVar50 < iVar80 || iVar80 == iVar50 && bVar3) & 1)) {
                  *(int *)((long)pvVar22 + lVar46) = iVar11;
                }
                if (iVar50 >= iVar80 && (iVar80 != iVar50 || !bVar3)) {
                  *(int *)((long)pvVar22 + lVar46 + 4) = iVar11 + 1;
                }
                lVar72 = auVar69._8_8_;
                auVar69._0_8_ = auVar69._0_8_ + auVar76._0_8_;
                auVar69._8_8_ = lVar72 + auVar76._8_8_;
                lVar46 = lVar46 + 8;
                iVar11 = iVar11 + 2;
              } while (uVar41 * 4 + 8 != lVar46);
              lVar46 = 0;
              do {
                dVar61 = ((double)*(int *)((long)pvVar22 + lVar46 * 4) + -1.0) / dVar58 - dVar57;
                dVar59 = cos((dVar61 * 6.283185307179586) / dVar56);
                dVar59 = dVar59 * 0.5 + 0.42;
                dVar61 = cos((dVar61 * 12.566370614359172) / dVar56);
                pvVar22 = (void *)CONCAT44(uVar92,uVar91);
                *(double *)((long)pvVar24 + lVar46 * 8) = dVar61 * 0.08 + dVar59;
                lVar46 = lVar46 + 1;
              } while (uVar41 + 1 != lVar46);
            }
            *pdVar20 = *(double *)((long)pvVar24 + 8) * -0.5;
            if (0 < iVar45) {
              lVar46 = 0;
              do {
                pdVar20[lVar46 + 1] =
                     (*(double *)((long)pvVar24 + lVar46 * 8 + 0x10) -
                     *(double *)((long)pvVar24 + lVar46 * 8)) * -0.5;
                lVar46 = lVar46 + 1;
              } while (uVar41 - 1 != lVar46);
            }
            pdVar20[(int)uVar42] = *(double *)((long)pvVar24 + lVar44 * 8 + -0x10) * 0.5;
            pvVar22 = operator_new__(uVar43);
            if (-1 < iVar45) {
              lVar46 = 0;
              do {
                iVar11 = *(int *)(CONCAT44(uVar92,uVar91) + lVar46 * 4) + -1;
                if ((int)(uVar30 - 1) < iVar11) {
                  iVar11 = uVar30 - 1;
                }
                if (iVar11 < 1) {
                  iVar11 = 0;
                }
                *(int *)((long)pvVar22 + lVar46 * 4) = iVar11;
                lVar46 = lVar46 + 1;
              } while (lVar44 != lVar46);
              lVar46 = 0;
              do {
                *(double *)(local_e8._8_8_ + lVar46 * 8) =
                     in[*(int *)((long)pvVar22 + lVar46 * 4)] *
                     *(double *)((long)pvVar24 + lVar46 * 8);
                lVar46 = lVar46 + 1;
              } while (lVar44 != lVar46);
            }
            if (iVar49 < iVar9) {
              memset((double *)(local_e8._8_8_ + lVar44 * 8),0,
                     (ulong)((uVar42 ^ 0xfffffffe) + iVar9) * 8 + 8);
            }
            lVar46 = 9;
            ppdVar29 = &pdStack_d0;
            puVar37 = (undefined8 *)&stack0xfffffffffffffd38;
            while( true ) {
              if (lVar46 == 0) break;
              lVar46 = lVar46 + -1;
              *puVar37 = *ppdVar29;
              ppdVar29 = ppdVar29 + (ulong)bVar54 * -2 + 1;
              puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
            }
            p_05.out._0_4_ = SUB84(dVar59,0);
            p_05.n = in_stack_fffffffffffffd60._0_4_;
            p_05.sign = in_stack_fffffffffffffd60._4_4_;
            p_05.flags = in_stack_fffffffffffffd60._8_4_;
            p_05._12_4_ = in_stack_fffffffffffffd60._12_4_;
            p_05.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
            p_05.in = (double *)in_stack_fffffffffffffd60._24_8_;
            p_05.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
            p_05.out._4_4_ = (int)((ulong)dVar59 >> 0x20);
            p_05.input._0_4_ = uVar34;
            p_05.input._4_4_ = uVar87;
            p_05.ip._0_4_ = uVar89;
            p_05.ip._4_4_ = uVar90;
            p_05.w._0_4_ = uVar91;
            p_05.w._4_4_ = uVar92;
            fft_execute(p_05);
            iVar11 = iVar9 / 2;
            if (-2 < iVar9) {
              lVar46 = 0;
              do {
                *(undefined8 *)((long)pvVar17 + lVar46) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar46);
                *(undefined8 *)((long)pvVar17 + lVar46 + 8) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar46 + 8);
                lVar46 = lVar46 + 0x10;
              } while ((ulong)(iVar11 + 1) << 4 != lVar46);
            }
            if (-1 < iVar45) {
              lVar46 = 0;
              do {
                *(double *)(local_e8._8_8_ + lVar46 * 8) =
                     in[*(int *)((long)pvVar22 + lVar46 * 4)] * pdVar20[lVar46];
                lVar46 = lVar46 + 1;
              } while (lVar44 != lVar46);
            }
            if (iVar49 < iVar9) {
              memset((double *)(local_e8._8_8_ + lVar44 * 8),0,
                     (ulong)((uVar42 ^ 0xfffffffe) + iVar9) * 8 + 8);
            }
            lVar44 = 9;
            ppdVar29 = &pdStack_d0;
            puVar37 = (undefined8 *)&stack0xfffffffffffffd38;
            while( true ) {
              if (lVar44 == 0) break;
              lVar44 = lVar44 + -1;
              *puVar37 = *ppdVar29;
              ppdVar29 = ppdVar29 + (ulong)bVar54 * -2 + 1;
              puVar37 = puVar37 + (ulong)bVar54 * -2 + 1;
            }
            p_06.out._0_4_ = SUB84(dVar59,0);
            p_06.n = in_stack_fffffffffffffd60._0_4_;
            p_06.sign = in_stack_fffffffffffffd60._4_4_;
            p_06.flags = in_stack_fffffffffffffd60._8_4_;
            p_06._12_4_ = in_stack_fffffffffffffd60._12_4_;
            p_06.c_in = (fft_complex *)in_stack_fffffffffffffd60._16_8_;
            p_06.in = (double *)in_stack_fffffffffffffd60._24_8_;
            p_06.c_out = (fft_complex *)in_stack_fffffffffffffd60._32_8_;
            p_06.out._4_4_ = (int)((ulong)dVar59 >> 0x20);
            p_06.input._0_4_ = uVar34;
            p_06.input._4_4_ = uVar87;
            p_06.ip._0_4_ = uVar89;
            p_06.ip._4_4_ = uVar90;
            p_06.w._0_4_ = uVar91;
            p_06.w._4_4_ = uVar92;
            fft_execute(p_06);
            if (-2 < iVar9) {
              lVar44 = 0;
              do {
                *(undefined8 *)((long)pvVar18 + lVar44) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar44);
                *(undefined8 *)((long)pvVar18 + lVar44 + 8) =
                     *(undefined8 *)((long)(double *)local_e8._16_8_ + lVar44 + 8);
                lVar44 = lVar44 + 0x10;
              } while ((ulong)(iVar11 + 1) << 4 != lVar44);
            }
            operator_delete__(pvVar22);
            uVar53 = (long)iVar11 * 8 + 8;
            if (iVar9 < -3) {
              uVar53 = 0xffffffffffffffff;
            }
            pvVar22 = operator_new__(uVar53);
            pvVar25 = operator_new__(uVar53);
            if (-2 < iVar9) {
              uVar53 = (ulong)(iVar11 + 1);
              lVar44 = 0;
              do {
                dVar56 = *(double *)((long)pvVar17 + lVar44 * 2);
                dVar57 = *(double *)((long)pvVar17 + lVar44 * 2 + 8);
                *(double *)((long)pvVar25 + lVar44) =
                     *(double *)((long)pvVar18 + lVar44 * 2 + 8) * dVar56 -
                     *(double *)((long)pvVar18 + lVar44 * 2) * dVar57;
                *(double *)((long)pvVar22 + lVar44) = dVar56 * dVar56 + dVar57 * dVar57;
                lVar44 = lVar44 + 8;
                uVar53 = uVar53 - 1;
              } while (uVar53 != 0);
            }
            uVar8 = (uint)pvVar25;
            uVar88 = (undefined4)((ulong)pvVar25 >> 0x20);
            uVar47 = (uint)((dVar58 * 0.5) / (double)CONCAT44(uVar90,uVar89));
            uVar42 = 6;
            if ((int)uVar47 < 6) {
              uVar42 = uVar47;
            }
            uVar53 = (long)(int)uVar42 << 3;
            if ((int)uVar47 < 0) {
              uVar53 = 0xffffffffffffffff;
            }
            pvVar25 = operator_new__(uVar53);
            pvVar26 = operator_new__(uVar53);
            if ((int)uVar47 < 1) {
              dVar56 = 0.0;
              dVar57 = 0.0;
            }
            else {
              dVar56 = (double)CONCAT44(uVar90,uVar89);
              uVar53 = 0;
              do {
                uVar41 = uVar53 + 1;
                iVar49 = matlab_round((double)(int)uVar41 * (((double)iVar9 * dVar56) / dVar58));
                dVar57 = *(double *)((long)pvVar22 + (long)iVar49 * 8);
                dVar59 = 0.0;
                if ((dVar57 != 0.0) || (NAN(dVar57))) {
                  auVar76._0_8_ = (double)iVar49 * dVar58;
                  auVar76._8_8_ =
                       (*(double *)(CONCAT44(uVar88,uVar8) + (long)iVar49 * 8) / dVar57) * dVar58 *
                       0.5;
                  auVar77._8_8_ = 0x400921fb54442d18;
                  auVar77._0_8_ = (double)iVar9;
                  auVar77 = divpd(auVar76,auVar77);
                  dVar59 = auVar77._8_8_ + auVar77._0_8_;
                }
                *(double *)((long)pvVar26 + uVar53 * 8) = dVar59;
                if (dVar57 < 0.0) {
                  dVar57 = sqrt(dVar57);
                }
                else {
                  dVar57 = SQRT(dVar57);
                }
                *(double *)((long)pvVar25 + uVar53 * 8) = dVar57;
                uVar53 = uVar41;
              } while (uVar42 != uVar41);
              dVar57 = 0.0;
              dVar59 = 0.0;
              dVar56 = 0.0;
              uVar53 = 0;
              do {
                dVar61 = *(double *)((long)pvVar26 + uVar53 * 8);
                dVar1 = *(double *)((long)pvVar25 + uVar53 * 8);
                uVar53 = uVar53 + 1;
                dVar57 = dVar57 + dVar61 * dVar1;
                dVar59 = dVar59 + (double)(uVar53 & 0xffffffff) * dVar1;
                dVar56 = dVar56 + (double)((ulong)((dVar61 / (double)(uVar53 & 0xffffffff) -
                                                   (double)CONCAT44(uVar90,uVar89)) /
                                                  (double)CONCAT44(uVar90,uVar89)) &
                                          (ulong)DAT_0012abb0);
              } while (uVar42 != uVar53);
              dVar57 = dVar57 / (dVar59 + 1e-12);
            }
            *(double *)(lVar52 + uVar38 * 8) = dVar56;
            *(double *)(lVar12 + uVar38 * 8) = dVar57;
            *(double *)(lVar52 + uVar38 * 8) =
                 1.0 / (*(double *)(lVar52 + uVar38 * 8) / (double)(int)uVar42 + 1e-12);
            operator_delete__(pvVar25);
            operator_delete__(pvVar26);
            operator_delete__(pvVar18);
            operator_delete__(pdVar20);
            operator_delete__(pvVar24);
            operator_delete__((void *)CONCAT44(uVar92,uVar91));
            operator_delete__((void *)CONCAT44(uVar88,uVar8));
            operator_delete__(pvVar22);
            operator_delete__(pvVar17);
            DestroyForwardRealFFT((ForwardRealFFT *)local_e8);
            dVar56 = *(double *)(lVar12 + uVar38 * 8);
            if (((dVar56 < f0_floor) || (f0_ceil < dVar56)) ||
               (pdVar20 = (double *)(lVar52 + uVar38 * 8), *pdVar20 <= 2.5 && *pdVar20 != 2.5)) {
              *(undefined8 *)(lVar12 + uVar38 * 8) = 0;
              *(undefined8 *)(lVar52 + uVar38 * 8) = 0;
            }
            operator_delete__(pdVar19);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar10);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar31);
  }
  pvVar17 = operator_new__(uVar14);
  if (-1 < (int)uVar34) {
    uVar39 = 0xffffffffffffffff;
    if (-1 < (int)uVar7) {
      uVar39 = (long)(int)uVar10 << 3;
    }
    uVar38 = 0;
    do {
      pvVar18 = operator_new__(uVar39);
      *(void **)((long)pvVar17 + uVar38 * 8) = pvVar18;
      uVar38 = uVar38 + 1;
    } while (uVar31 != uVar38);
    if (-1 < (int)uVar34) {
      uVar39 = 0;
      do {
        if (0 < (int)uVar7) {
          lVar12 = plVar15[uVar39];
          lVar52 = *(long *)((long)pvVar17 + uVar39 * 8);
          uVar38 = 0;
          do {
            *(undefined8 *)(lVar52 + uVar38 * 8) = *(undefined8 *)(lVar12 + uVar38 * 8);
            uVar38 = uVar38 + 1;
          } while (uVar10 != uVar38);
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != uVar31);
    }
  }
  if (1 < (int)uVar34) {
    uVar39 = (ulong)uVar10;
    uVar38 = 1;
    uVar53 = (ulong)DAT_0012abb0;
    do {
      if (0 < (int)uVar7) {
        lVar12 = plVar15[uVar38];
        uVar41 = 0;
        do {
          dVar56 = *(double *)(lVar12 + uVar41 * 8);
          if ((dVar56 != 0.0) || (NAN(dVar56))) {
            dVar57 = 1.0;
            uVar43 = 0;
            dVar58 = 1.0;
            do {
              dVar59 = (double)((ulong)(dVar56 - *(double *)
                                                  (*(long *)((long)pvVar17 + uVar38 * 8 + 8) +
                                                  uVar43 * 8)) & uVar53) / dVar56;
              dVar57 = (double)(-(ulong)(dVar58 < dVar59) & (ulong)dVar57 |
                               ~-(ulong)(dVar58 < dVar59) & (ulong)dVar59);
              if (dVar59 <= dVar58) {
                dVar58 = dVar59;
              }
              uVar43 = uVar43 + 1;
            } while (uVar39 != uVar43);
            auVar85 = ZEXT816(0x3ff0000000000000);
            uVar43 = 0;
            auVar82 = ZEXT816(0x3ff0000000000000);
            do {
              dVar58 = (double)((ulong)(dVar56 - *(double *)
                                                  (*(long *)((long)pvVar17 + uVar38 * 8 + -8) +
                                                  uVar43 * 8)) & uVar53) / dVar56;
              uVar55 = -(ulong)(auVar82._0_8_ < dVar58);
              auVar84._0_8_ = uVar55 & auVar85._0_8_;
              auVar84._8_8_ = auVar82._8_8_ & auVar85._8_8_;
              auVar85._8_8_ = 0;
              auVar85._0_8_ = ~uVar55 & (ulong)dVar58;
              auVar85 = auVar84 | auVar85;
              if (dVar58 <= auVar82._0_8_) {
                auVar82._0_8_ = dVar58;
              }
              uVar43 = uVar43 + 1;
            } while (uVar39 != uVar43);
            if (auVar85._0_8_ <= dVar57) {
              dVar57 = auVar85._0_8_;
            }
            if (0.05 < dVar57) {
              *(undefined8 *)(lVar12 + uVar41 * 8) = 0;
              *(undefined8 *)(*(long *)((long)pvVar16 + uVar38 * 8) + uVar41 * 8) = 0;
            }
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar39);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar34);
  }
  if (-1 < (int)uVar34) {
    uVar39 = 0;
    do {
      pvVar18 = *(void **)((long)pvVar17 + uVar39 * 8);
      if (pvVar18 != (void *)0x0) {
        operator_delete__(pvVar18);
      }
      uVar39 = uVar39 + 1;
    } while (uVar31 != uVar39);
  }
  operator_delete__(pvVar17);
  pvVar17 = operator_new__(uVar14);
  pvVar18 = operator_new__(uVar14);
  pdVar27 = (double *)operator_new__(uVar14);
  if (-1 < (int)uVar34) {
    uVar39 = 0;
    do {
      *(undefined8 *)((long)pvVar18 + uVar39 * 8) = 0;
      if (0 < (int)uVar7) {
        lVar12 = *(long *)((long)pvVar16 + uVar39 * 8);
        dVar56 = 0.0;
        uVar38 = 0;
        do {
          if (dVar56 < *(double *)(lVar12 + uVar38 * 8)) {
            *(undefined8 *)((long)pvVar18 + uVar39 * 8) =
                 *(undefined8 *)(plVar15[uVar39] + uVar38 * 8);
            dVar56 = *(double *)(lVar12 + uVar38 * 8);
          }
          uVar38 = uVar38 + 1;
        } while (uVar10 != uVar38);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar31);
    memset(pdVar27,0,uVar31 * 8);
  }
  if (1 < (int)uVar34) {
    uVar39 = 2;
    uVar38 = (ulong)DAT_0012abb0;
    do {
      dVar56 = *(double *)((long)pvVar18 + uVar39 * 8);
      if ((dVar56 != 0.0) || (NAN(dVar56))) {
        dVar57 = *(double *)((long)pvVar18 + uVar39 * 8 + -8);
        dVar58 = (dVar57 + dVar57) - *(double *)((long)pvVar18 + uVar39 * 8 + -0x10);
        if (((double)((ulong)((dVar56 - dVar58) / dVar58) & uVar38) <= 0.008) ||
           (dVar58 = 0.0, (double)((ulong)(dVar56 - dVar57) & uVar38) / dVar57 <= 0.008)) {
          dVar58 = dVar56;
        }
        pdVar27[uVar39] = dVar58;
      }
      uVar39 = uVar39 + 1;
    } while (uVar31 != uVar39);
  }
  if (-1 < (int)uVar34) {
    memcpy(pvVar18,pdVar27,uVar31 * 8);
  }
  uVar87 = SUB84(pvVar18,0);
  uVar88 = (undefined4)((ulong)pvVar18 >> 0x20);
  uVar39 = 0xffffffffffffffff;
  if (-2 < (int)uVar34) {
    uVar39 = lVar32 << 2;
  }
  uVar89 = (undefined4)uVar39;
  uVar90 = (undefined4)(uVar39 >> 0x20);
  piVar28 = (int *)operator_new__(uVar39);
  uVar30 = GetBoundaryList(pdVar27,xi_length,piVar28);
  if (1 < (int)uVar30) {
    uVar39 = 0;
    do {
      iVar49 = piVar28[uVar39 * 2];
      uVar8 = piVar28[uVar39 * 2 + 1] - iVar49;
      if ((iVar49 <= piVar28[uVar39 * 2 + 1]) && ((int)uVar8 < 6)) {
        memset((void *)(CONCAT44(uVar88,uVar87) + (long)iVar49 * 8),0,(ulong)uVar8 * 8 + 8);
      }
      uVar39 = uVar39 + 1;
    } while (uVar30 >> 1 != uVar39);
  }
  operator_delete__(piVar28);
  pdVar19 = (double *)CONCAT44(uVar88,uVar87);
  if (-1 < (int)uVar34) {
    memcpy(pdVar27,pdVar19,uVar31 * 8);
  }
  piVar28 = (int *)operator_new__(CONCAT44(uVar90,uVar89));
  iVar49 = GetBoundaryList(pdVar19,xi_length,piVar28);
  uVar30 = iVar49 / 2;
  uVar39 = 0xffffffffffffffff;
  if (-2 < iVar49) {
    uVar39 = (long)(int)uVar30 << 3;
  }
  ppdVar29 = (double **)operator_new__(uVar39);
  if (iVar49 < 2) {
    GetMultiChannelF0(pdVar19,xi_length,piVar28,iVar49,ppdVar29);
    uVar8 = 0;
  }
  else {
    uVar38 = (ulong)uVar30;
    uVar39 = 0;
    do {
      pdVar19 = (double *)operator_new__(uVar14);
      ppdVar29[uVar39] = pdVar19;
      uVar39 = uVar39 + 1;
    } while (uVar38 != uVar39);
    GetMultiChannelF0((double *)CONCAT44(uVar88,uVar87),xi_length,piVar28,iVar49,ppdVar29);
    iVar45 = uVar34 - 1;
    uVar39 = 0;
    do {
      iVar9 = piVar28[uVar39 * 2 + 1] + 100;
      if (iVar45 < iVar9) {
        iVar9 = iVar45;
      }
      iVar9 = ExtendF0((double *)(ulong)(uint)piVar28[uVar39 * 2 + 1],iVar9,1,(int)plVar15,uVar10,
                       (double **)ppdVar29[uVar39],in_stack_fffffffffffffd38,channels_in_octave,
                       in_stack_fffffffffffffd40);
      piVar28[uVar39 * 2 + 1] = iVar9;
      uVar8 = piVar28[uVar39 * 2];
      uVar42 = 0x65;
      if (0x65 < (int)uVar8) {
        uVar42 = uVar8;
      }
      iVar9 = ExtendF0((double *)(ulong)uVar8,uVar42 - 100,-1,(int)plVar15,uVar10,
                       (double **)ppdVar29[uVar39],in_stack_fffffffffffffd38,channels_in_octave,
                       in_stack_fffffffffffffd40);
      piVar28[uVar39 * 2] = iVar9;
      uVar39 = uVar39 + 1;
    } while (uVar38 != uVar39);
    dVar56 = 0.0;
    uVar39 = 0;
    uVar8 = 0;
    do {
      iVar45 = piVar28[uVar39 * 2];
      iVar9 = piVar28[uVar39 * 2 + 1];
      if (iVar9 - iVar45 != 0 && iVar45 <= iVar9) {
        lVar12 = (long)iVar45;
        do {
          dVar56 = dVar56 + ppdVar29[uVar39][lVar12];
          lVar12 = lVar12 + 1;
        } while (iVar9 != lVar12);
      }
      dVar57 = (double)(iVar9 - iVar45);
      dVar56 = dVar56 / dVar57;
      if (2200.0 / dVar56 < dVar57) {
        pdVar19 = ppdVar29[(int)uVar8];
        ppdVar29[(int)uVar8] = ppdVar29[uVar39];
        ppdVar29[uVar39] = pdVar19;
        uVar2 = *(undefined8 *)(piVar28 + (int)(uVar8 * 2));
        piVar28[(int)(uVar8 * 2)] = iVar45;
        piVar28[(int)(uVar8 * 2 + 1)] = iVar9;
        *(undefined8 *)(piVar28 + uVar39 * 2) = uVar2;
        uVar8 = uVar8 + 1;
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar38);
  }
  if (uVar8 != 0) {
    uVar39 = 0xffffffffffffffff;
    if (-1 < (int)uVar8) {
      uVar39 = (long)(int)uVar8 << 2;
    }
    pvVar18 = operator_new__(uVar39);
    auVar76 = _DAT_0012b210;
    auVar77 = _DAT_0012aa40;
    uVar39 = (ulong)uVar8;
    if (0 < (int)uVar8) {
      lVar12 = uVar39 - 1;
      auVar64._8_4_ = (int)lVar12;
      auVar64._0_8_ = lVar12;
      auVar64._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar38 = 0;
      auVar64 = auVar64 ^ _DAT_0012aa40;
      auVar70 = _DAT_0012aa30;
      do {
        bVar3 = auVar64._0_4_ < SUB164(auVar70 ^ auVar77,0);
        iVar45 = auVar64._4_4_;
        iVar9 = SUB164(auVar70 ^ auVar77,4);
        if ((bool)(~(iVar45 < iVar9 || iVar9 == iVar45 && bVar3) & 1)) {
          *(int *)((long)pvVar18 + uVar38 * 4) = (int)uVar38;
        }
        if (iVar45 >= iVar9 && (iVar9 != iVar45 || !bVar3)) {
          *(int *)((long)pvVar18 + uVar38 * 4 + 4) = (int)uVar38 + 1;
        }
        uVar38 = uVar38 + 2;
        lVar12 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + auVar76._0_8_;
        auVar70._8_8_ = lVar12 + auVar76._8_8_;
      } while ((uVar8 + 1 & 0xfffffffe) != uVar38);
    }
    if (1 < (int)uVar8) {
      uVar38 = 1;
      lVar32 = 2;
      lVar12 = lVar32;
LAB_00125639:
      do {
        uVar53 = (ulong)((int)lVar32 - 2);
        iVar45 = *(int *)((long)pvVar18 + uVar53 * 4);
        iVar9 = *(int *)((long)pvVar18 + uVar38 * 4);
        if (piVar28[(long)iVar9 * 2] < piVar28[(long)iVar45 * 2]) {
          *(int *)((long)pvVar18 + uVar38 * 4) = iVar45;
          *(int *)((long)pvVar18 + uVar53 * 4) = iVar9;
          lVar32 = lVar32 + -1;
          if (1 < lVar32) goto LAB_00125639;
        }
        uVar38 = uVar38 + 1;
        lVar32 = lVar12 + 1;
        lVar12 = lVar32;
      } while (uVar38 != uVar39);
    }
    if (-1 < (int)uVar34) {
      pdVar19 = *ppdVar29;
      uVar38 = 0;
      do {
        pdVar27[uVar38] = pdVar19[uVar38];
        uVar38 = uVar38 + 1;
      } while (uVar31 != uVar38);
    }
    if (1 < (int)uVar8) {
      iVar45 = piVar28[1];
      uVar38 = 1;
      do {
        iVar9 = *(int *)((long)pvVar18 + uVar38 * 4);
        lVar12 = (long)iVar9;
        uVar8 = iVar9 * 2;
        iVar9 = piVar28[lVar12 * 2];
        lVar32 = (long)iVar9;
        if (iVar45 < iVar9) {
          iVar50 = piVar28[(int)(uVar8 | 1)];
          if (iVar9 <= iVar50) {
            pdVar19 = ppdVar29[lVar12];
            lVar12 = 0;
            do {
              pdVar27[lVar32 + lVar12] = pdVar19[lVar32 + lVar12];
              lVar12 = lVar12 + 1;
            } while ((iVar50 - iVar9) + 1 != (int)lVar12);
          }
          *piVar28 = iVar9;
        }
        else {
          pdVar19 = ppdVar29[lVar12];
          iVar11 = piVar28[(int)(uVar8 | 1)];
          if ((iVar9 < *piVar28) || (iVar50 = iVar45, iVar45 < iVar11)) {
            dVar56 = 0.0;
            dVar57 = 0.0;
            lVar12 = lVar32;
            do {
              lVar52 = *(long *)((long)pvVar16 + lVar12 * 8);
              auVar74 = ZEXT816(0);
              dVar58 = 0.0;
              if (0 < (int)uVar7) {
                uVar53 = 0;
                do {
                  dVar58 = *(double *)(plVar15[lVar12] + uVar53 * 8);
                  if (((dVar58 == pdVar27[lVar12]) && (!NAN(dVar58) && !NAN(pdVar27[lVar12]))) &&
                     (dVar58 = *(double *)(lVar52 + uVar53 * 8), auVar74._0_8_ < dVar58)) {
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = dVar58;
                  }
                  dVar58 = auVar74._0_8_;
                  uVar53 = uVar53 + 1;
                } while (uVar10 != uVar53);
              }
              if ((int)uVar7 < 1) {
                dVar59 = 0.0;
              }
              else {
                auVar78 = (undefined1  [16])0x0;
                uVar53 = 0;
                do {
                  dVar59 = *(double *)(plVar15[lVar12] + uVar53 * 8);
                  if (((dVar59 == pdVar19[lVar12]) && (!NAN(dVar59) && !NAN(pdVar19[lVar12]))) &&
                     (dVar59 = *(double *)(lVar52 + uVar53 * 8), auVar78._0_8_ < dVar59)) {
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = dVar59;
                  }
                  dVar59 = auVar78._0_8_;
                  uVar53 = uVar53 + 1;
                } while (uVar10 != uVar53);
              }
              dVar56 = dVar56 + dVar59;
              dVar57 = dVar57 + dVar58;
              lVar12 = lVar12 + 1;
            } while (iVar45 + 1 != (int)lVar12);
            iVar50 = iVar11;
            if (dVar57 <= dVar56) {
              if (iVar9 <= iVar11) {
                lVar12 = 0;
                do {
                  pdVar27[lVar32 + lVar12] = pdVar19[lVar32 + lVar12];
                  lVar12 = lVar12 + 1;
                } while ((iVar11 - iVar9) + 1 != (int)lVar12);
              }
            }
            else if (iVar45 <= iVar11) {
              lVar12 = 0;
              do {
                pdVar27[iVar45 + lVar12] = pdVar19[iVar45 + lVar12];
                lVar12 = lVar12 + 1;
              } while ((iVar11 - iVar45) + 1 != (int)lVar12);
            }
          }
        }
        iVar45 = iVar50;
        piVar28[1] = iVar45;
        uVar38 = uVar38 + 1;
      } while (uVar38 != uVar39);
    }
    operator_delete__(pvVar18);
  }
  if (1 < iVar49) {
    uVar39 = 0;
    do {
      if (ppdVar29[uVar39] != (double *)0x0) {
        operator_delete__(ppdVar29[uVar39]);
      }
      uVar39 = uVar39 + 1;
    } while (uVar30 != uVar39);
  }
  operator_delete__(ppdVar29);
  operator_delete__(piVar28);
  if (-1 < (int)uVar34) {
    memcpy(pvVar17,pdVar27,uVar31 * 8);
  }
  piVar28 = (int *)operator_new__(CONCAT44(uVar90,uVar89));
  uVar7 = GetBoundaryList(pdVar27,xi_length,piVar28);
  auVar76 = _DAT_0012aa40;
  auVar77 = _DAT_0012aa30;
  if (3 < (int)uVar7) {
    uVar30 = 2;
    if (2 < uVar7 >> 1) {
      uVar30 = uVar7 >> 1;
    }
    uVar39 = 0;
    do {
      iVar49 = piVar28[uVar39 * 2 + 2];
      uVar7 = piVar28[uVar39 * 2 + 1];
      lVar12 = (long)(int)uVar7;
      if (((int)(~uVar7 + iVar49) < 9) && ((int)uVar7 < iVar49 + -1)) {
        dVar57 = pdVar27[lVar12] + 1.0;
        dVar56 = ((pdVar27[iVar49] + -1.0) - dVar57) / ((double)(int)(~uVar7 + iVar49) + 1.0);
        lVar32 = (iVar49 + -1) - lVar12;
        lVar52 = lVar32 + -1;
        auVar83._8_4_ = (int)lVar52;
        auVar83._0_8_ = lVar52;
        auVar83._12_4_ = (int)((ulong)lVar52 >> 0x20);
        auVar83 = auVar83 ^ auVar76;
        uVar38 = 0;
        do {
          iVar49 = (int)uVar38;
          auVar86._8_4_ = iVar49;
          auVar86._0_8_ = uVar38;
          auVar86._12_4_ = (int)(uVar38 >> 0x20);
          auVar73 = (auVar86 | auVar77) ^ auVar76;
          if ((bool)(~(auVar73._4_4_ == auVar83._4_4_ && auVar83._0_4_ < auVar73._0_4_ ||
                      auVar83._4_4_ < auVar73._4_4_) & 1)) {
            *(double *)((long)pvVar17 + uVar38 * 8 + lVar12 * 8 + 8) =
                 (double)(iVar49 + 1) * dVar56 + dVar57;
          }
          if ((auVar73._12_4_ != auVar83._12_4_ || auVar73._8_4_ <= auVar83._8_4_) &&
              auVar73._12_4_ <= auVar83._12_4_) {
            *(double *)((long)pvVar17 + uVar38 * 8 + lVar12 * 8 + 0x10) =
                 (double)(iVar49 + 2) * dVar56 + dVar57;
          }
          uVar38 = uVar38 + 2;
        } while ((lVar32 + 1U & 0xfffffffffffffffe) != uVar38);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar30 - 1);
  }
  operator_delete__(piVar28);
  operator_delete__((void *)CONCAT44(uVar88,uVar87));
  operator_delete__(pdVar27);
  iVar49 = uVar34 + 0x259;
  uVar39 = (long)iVar49 * 8;
  if ((int)uVar34 < -0x259) {
    uVar39 = 0xffffffffffffffff;
  }
  uVar87 = (undefined4)uVar39;
  uVar88 = (undefined4)(uVar39 >> 0x20);
  uVar7 = uVar34;
  pdVar27 = (double *)operator_new__(uVar39);
  memset(pdVar27,0,0x960);
  iVar45 = uVar34 + 0x12d;
  if (-1 < (int)uVar34) {
    iVar9 = 0x12d;
    if (0x12d < iVar45) {
      iVar9 = iVar45;
    }
    memcpy(pdVar27 + 300,pvVar17,(ulong)(iVar9 - 300) << 3);
  }
  iVar9 = uVar7 + 0x12e;
  if ((int)(uVar7 + 0x12e) < iVar49) {
    iVar9 = iVar49;
  }
  uVar34 = uVar7;
  memset(pdVar27 + iVar45,0,(ulong)((iVar9 - uVar7) - 0x12e) * 8 + 8);
  uVar39 = (long)iVar49 << 2;
  if ((int)uVar7 < -0x259) {
    uVar39 = 0xffffffffffffffff;
  }
  piVar28 = (int *)operator_new__(uVar39);
  iVar45 = GetBoundaryList(pdVar27,iVar49,piVar28);
  uVar7 = iVar45 / 2;
  uVar39 = (long)(int)uVar7 << 3;
  if (iVar45 < -1) {
    uVar39 = 0xffffffffffffffff;
  }
  ppdVar29 = (double **)operator_new__(uVar39);
  if (iVar45 < 2) {
    GetMultiChannelF0(pdVar27,iVar49,piVar28,iVar45,ppdVar29);
  }
  else {
    uVar38 = 0;
    uVar39 = CONCAT44(uVar88,uVar87);
    do {
      pdVar19 = (double *)operator_new__(uVar39);
      ppdVar29[uVar38] = pdVar19;
      uVar38 = uVar38 + 1;
    } while (uVar7 != uVar38);
    GetMultiChannelF0(pdVar27,iVar49,piVar28,iVar45,ppdVar29);
    if (iVar45 < 2) goto LAB_00125ed2;
    uVar89 = 0;
    iVar11 = uVar34 + 600;
    uVar39 = 0;
    iVar9 = iVar49;
    do {
      pdVar19 = ppdVar29[uVar39];
      iVar50 = piVar28[uVar39 * 2];
      lVar12 = (long)iVar50;
      iVar80 = piVar28[uVar39 * 2 + 1];
      pdVar20 = (double *)operator_new__(CONCAT44(uVar88,uVar87));
      auVar77 = _DAT_0012aa40;
      if (0 < lVar12) {
        lVar32 = lVar12 + -1;
        auVar65._8_4_ = (int)lVar32;
        auVar65._0_8_ = lVar32;
        auVar65._12_4_ = (int)((ulong)lVar32 >> 0x20);
        auVar65 = auVar65 ^ _DAT_0012aa40;
        lVar32 = 0;
        auVar71 = _DAT_0012aa30;
        do {
          bVar3 = auVar65._0_4_ < SUB164(auVar71 ^ auVar77,0);
          iVar66 = auVar65._4_4_;
          iVar79 = SUB164(auVar71 ^ auVar77,4);
          dVar56 = pdVar19[lVar12];
          if ((bool)(~(iVar66 < iVar79 || iVar79 == iVar66 && bVar3) & 1)) {
            *(double *)((long)pdVar19 + lVar32) = dVar56;
          }
          if (iVar66 >= iVar79 && (iVar79 != iVar66 || !bVar3)) {
            *(double *)((long)pdVar19 + lVar32 + 8) = dVar56;
          }
          lVar52 = auVar71._8_8_;
          auVar71._0_8_ = auVar71._0_8_ + 2;
          auVar71._8_8_ = lVar52 + 2;
          lVar32 = lVar32 + 0x10;
        } while ((ulong)(iVar50 + 1U >> 1) << 4 != lVar32);
      }
      lVar12 = (long)iVar80 + 1;
      if ((int)lVar12 < iVar49) {
        lVar32 = 0;
        do {
          pdVar19[lVar12 + lVar32] = pdVar19[iVar80];
          lVar32 = lVar32 + 1;
        } while (iVar11 - iVar80 != (int)lVar32);
      }
      if (-0x259 < (int)uVar34) {
        lVar12 = CONCAT44(uVar89,iVar9);
        dVar56 = 0.0;
        dVar57 = 0.0;
        do {
          dVar58 = dVar56;
          dVar56 = dVar57 * -0.7660066009432641 + dVar58 * 1.7347257688092754 + *pdVar19;
          pdVar20[lVar12 + -1] =
               dVar57 * 0.007820208033497172 +
               dVar56 * 0.007820208033497172 + dVar58 * 0.015640416066994345;
          pdVar19 = pdVar19 + 1;
          lVar12 = lVar12 + -1;
          dVar57 = dVar58;
        } while (lVar12 != 0);
        lVar12 = CONCAT44(uVar89,iVar9);
        pdVar19 = pdVar20;
        dVar56 = 0.0;
        dVar57 = 0.0;
        do {
          dVar58 = dVar56;
          dVar56 = dVar57 * -0.7660066009432641 + dVar58 * 1.7347257688092754 + *pdVar19;
          pdVar27[lVar12 + -1] =
               dVar57 * 0.007820208033497172 +
               dVar56 * 0.007820208033497172 + dVar58 * 0.015640416066994345;
          pdVar19 = pdVar19 + 1;
          lVar12 = lVar12 + -1;
          dVar57 = dVar58;
        } while (lVar12 != 0);
      }
      operator_delete__(pdVar20);
      iVar50 = piVar28[uVar39 * 2];
      if (iVar50 <= piVar28[uVar39 * 2 + 1]) {
        memcpy(temporal_positions + (long)iVar50 + -300,pdVar27 + iVar50,
               (ulong)(uint)(piVar28[uVar39 * 2 + 1] - iVar50) * 8 + 8);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar7);
  }
  if (1 < iVar45) {
    uVar39 = 0;
    do {
      if (ppdVar29[uVar39] != (double *)0x0) {
        operator_delete__(ppdVar29[uVar39]);
      }
      uVar39 = uVar39 + 1;
    } while (uVar7 != uVar39);
  }
LAB_00125ed2:
  operator_delete__(ppdVar29);
  operator_delete__(pdVar27);
  operator_delete__(piVar28);
  operator_delete__(in);
  operator_delete__(pvVar17);
  operator_delete__(out);
  if (-1 < (int)uVar34) {
    uVar39 = 0;
    do {
      if ((void *)plVar15[uVar39] != (void *)0x0) {
        operator_delete__((void *)plVar15[uVar39]);
      }
      pvVar17 = *(void **)((long)pvVar16 + uVar39 * 8);
      if (pvVar17 != (void *)0x0) {
        operator_delete__(pvVar17);
      }
      uVar39 = uVar39 + 1;
    } while (uVar31 != uVar39);
  }
  operator_delete__(plVar15);
  operator_delete__(pvVar16);
  operator_delete__(pdVar13);
  return;
}

Assistant:

static void HarvestGeneralBody(const double *x, int x_length, int fs,
    int frame_period, double f0_floor, double f0_ceil,
#if 0
    double channels_in_octave, int speed, double *temporal_positions,
    double *f0) {
#else
    double channels_in_octave, int speed, double allowed_range,
    double *temporal_positions, double *f0) {
#endif
  double adjusted_f0_floor = f0_floor * 0.9;
  double adjusted_f0_ceil = f0_ceil * 1.1;
  int number_of_channels =
    1 + static_cast<int>(log(adjusted_f0_ceil / adjusted_f0_floor) /
    world::kLog2 * channels_in_octave);
  double *boundary_f0_list = new double[number_of_channels];
  for (int i = 0; i < number_of_channels; ++i)
    boundary_f0_list[i] =
    adjusted_f0_floor * pow(2.0, (i + 1) / channels_in_octave);

  // normalization
  int decimation_ratio = MyMaxInt(MyMinInt(speed, 12), 1);
  int y_length =
    static_cast<int>(ceil(static_cast<double>(x_length) / decimation_ratio));
  double actual_fs = static_cast<double>(fs) / decimation_ratio;
  int fft_size = GetSuitableFFTSize(y_length + 5 +
    2 * static_cast<int>(2.0 * actual_fs / boundary_f0_list[0]));

  // Calculation of the spectrum used for the f0 estimation
  double *y = new double[fft_size];
  fft_complex *y_spectrum = new fft_complex[fft_size];
  GetWaveformAndSpectrum(x, x_length, y_length, actual_fs, fft_size,
      decimation_ratio, y, y_spectrum);

  int f0_length = GetSamplesForHarvest(fs, x_length, frame_period);
  for (int i = 0; i < f0_length; ++i) {
    temporal_positions[i] = i * frame_period / 1000.0;
    f0[i] = 0.0;
  }

  int overlap_parameter = 7;
  int max_candidates =
    matlab_round(number_of_channels / 10.0) * overlap_parameter;
  double **f0_candidates = new double *[f0_length];
  double **f0_candidates_score = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    f0_candidates[i] = new double[max_candidates];
    f0_candidates_score[i] = new double[max_candidates];
  }

  int number_of_candidates = HarvestGeneralBodySub(boundary_f0_list,
    number_of_channels, f0_length, actual_fs, y_length, temporal_positions,
    y_spectrum, fft_size, f0_floor, f0_ceil, max_candidates, f0_candidates) *
    overlap_parameter;

  RefineF0Candidates(y, y_length, actual_fs, temporal_positions, f0_length,
      number_of_candidates, f0_floor, f0_ceil, f0_candidates,
      f0_candidates_score);
  RemoveUnreliableCandidates(f0_length, number_of_candidates,
      f0_candidates, f0_candidates_score);

  double *best_f0_contour = new double[f0_length];
  FixF0Contour(f0_candidates, f0_candidates_score, f0_length,
#if 0
      number_of_candidates, best_f0_contour);
#else
      number_of_candidates, allowed_range, best_f0_contour);
#endif
  SmoothF0Contour(best_f0_contour, f0_length, f0);

  delete[] y;
  delete[] best_f0_contour;
  delete[] y_spectrum;
  for (int i = 0; i < f0_length; ++i) {
    delete[] f0_candidates[i];
    delete[] f0_candidates_score[i];
  }
  delete[] f0_candidates;
  delete[] f0_candidates_score;
  delete[] boundary_f0_list;
}